

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SO3.h
# Opt level: O2

shared_ptr<mnf::Manifold> __thiscall
mnf::SO3<mnf::ExpMapQuaternion>::getNewCopy_(SO3<mnf::ExpMapQuaternion> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  SO3<mnf::ExpMapQuaternion> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SO3<mnf::ExpMapQuaternion> *in_RSI;
  shared_ptr<mnf::Manifold> sVar2;
  shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>_> copySO3;
  undefined8 local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_20;
  
  this_00 = (SO3<mnf::ExpMapQuaternion> *)operator_new(0xa0);
  SO3(this_00,in_RSI);
  std::__shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>,void>
            ((__shared_ptr<mnf::SO3<mnf::ExpMapQuaternion>,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             this_00);
  _Var1._M_pi = _Stack_20._M_pi;
  _Stack_20._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 *)this = local_28;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x8 = _Var1._M_pi;
  local_28 = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_20);
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &this->super_Manifold
  ;
  return (shared_ptr<mnf::Manifold>)
         sVar2.super___shared_ptr<mnf::Manifold,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Manifold> SO3<Map>::getNewCopy_() const
{
  std::shared_ptr<SO3<Map> > copySO3(new SO3<Map>(*this));
  return copySO3;
}